

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallTargetGenerator::AddStripRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *toDestDirPath)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  ostream *poVar4;
  string *psVar5;
  bool local_142;
  allocator<char> local_121;
  string local_120;
  int local_fc;
  int local_f8;
  allocator<char> local_f1;
  string local_f0;
  string local_d0 [8];
  string stripArgs;
  string local_a8;
  byte local_83;
  byte local_82;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *toDestDirPath_local;
  ostream *os_local;
  cmInstallTargetGenerator *this_local;
  Indent indent_local;
  
  local_28 = toDestDirPath;
  toDestDirPath_local = (string *)os;
  os_local = (ostream *)this;
  this_local._4_4_ = indent.Level;
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if ((TVar2 != STATIC_LIBRARY) && ((this->ImportLibrary & 1U) == 0)) {
    pcVar3 = cmTarget::GetMakefile(this->Target->Target);
    std::allocator<char>::allocator();
    local_82 = 0;
    local_83 = 0;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"APPLE",&local_49);
    bVar1 = cmMakefile::IsOn(pcVar3,&local_48);
    local_142 = false;
    if (bVar1) {
      this_00 = this->Target;
      std::allocator<char>::allocator();
      local_82 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"MACOSX_BUNDLE",&local_81);
      local_83 = 1;
      local_142 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_80);
    }
    if ((local_83 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_80);
    }
    if ((local_82 & 1) != 0) {
      std::allocator<char>::~allocator(&local_81);
    }
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    if (local_142 == false) {
      pcVar3 = cmTarget::GetMakefile(this->Target->Target);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"CMAKE_STRIP",
                 (allocator<char> *)(stripArgs.field_2._M_local_buf + 0xf));
      bVar1 = cmMakefile::IsSet(pcVar3,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator((allocator<char> *)(stripArgs.field_2._M_local_buf + 0xf));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::__cxx11::string::string(local_d0);
        pcVar3 = cmTarget::GetMakefile(this->Target->Target);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"APPLE",&local_f1);
        bVar1 = cmMakefile::IsOn(pcVar3,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::allocator<char>::~allocator(&local_f1);
        if (bVar1) {
          TVar2 = cmGeneratorTarget::GetType(this->Target);
          if ((TVar2 == SHARED_LIBRARY) ||
             (TVar2 = cmGeneratorTarget::GetType(this->Target), TVar2 == MODULE_LIBRARY)) {
            std::__cxx11::string::operator=(local_d0,"-x ");
          }
          else {
            TVar2 = cmGeneratorTarget::GetType(this->Target);
            if (TVar2 == EXECUTABLE) {
              std::__cxx11::string::operator=(local_d0,"-u -r ");
            }
          }
        }
        local_f8 = this_local._4_4_;
        poVar4 = ::operator<<((ostream *)toDestDirPath_local,
                              (cmScriptGeneratorIndent)this_local._4_4_);
        std::operator<<(poVar4,"if(CMAKE_INSTALL_DO_STRIP)\n");
        local_fc = this_local._4_4_;
        poVar4 = ::operator<<((ostream *)toDestDirPath_local,
                              (cmScriptGeneratorIndent)this_local._4_4_);
        poVar4 = std::operator<<(poVar4,"  execute_process(COMMAND \"");
        pcVar3 = cmTarget::GetMakefile(this->Target->Target);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"CMAKE_STRIP",&local_121);
        psVar5 = cmMakefile::GetSafeDefinition(pcVar3,&local_120);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        poVar4 = std::operator<<(poVar4,"\" ");
        poVar4 = std::operator<<(poVar4,local_d0);
        poVar4 = std::operator<<(poVar4,"\"");
        poVar4 = std::operator<<(poVar4,(string *)local_28);
        std::operator<<(poVar4,"\")\n");
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator(&local_121);
        poVar4 = ::operator<<((ostream *)toDestDirPath_local,
                              (cmScriptGeneratorIndent)this_local._4_4_);
        std::operator<<(poVar4,"endif()\n");
        std::__cxx11::string::~string(local_d0);
      }
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddStripRule(std::ostream& os, Indent indent,
                                            const std::string& toDestDirPath)
{

  // don't strip static and import libraries, because it removes the only
  // symbol table they have so you can't link to them anymore
  if (this->Target->GetType() == cmStateEnums::STATIC_LIBRARY ||
      this->ImportLibrary) {
    return;
  }

  // Don't handle OSX Bundles.
  if (this->Target->Target->GetMakefile()->IsOn("APPLE") &&
      this->Target->GetPropertyAsBool("MACOSX_BUNDLE")) {
    return;
  }

  if (!this->Target->Target->GetMakefile()->IsSet("CMAKE_STRIP")) {
    return;
  }

  std::string stripArgs;

  // macOS 'strip' is picky, executables need '-u -r' and dylibs need '-x'.
  if (this->Target->Target->GetMakefile()->IsOn("APPLE")) {
    if (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY) {
      stripArgs = "-x ";
    } else if (this->Target->GetType() == cmStateEnums::EXECUTABLE) {
      stripArgs = "-u -r ";
    }
  }

  os << indent << "if(CMAKE_INSTALL_DO_STRIP)\n";
  os << indent << "  execute_process(COMMAND \""
     << this->Target->Target->GetMakefile()->GetSafeDefinition("CMAKE_STRIP")
     << "\" " << stripArgs << "\"" << toDestDirPath << "\")\n";
  os << indent << "endif()\n";
}